

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_mgga_xc_kcis.c
# Opt level: O2

void hyb_mgga_xc_kcis_init(xc_func_type *p)

{
  double alpha;
  uint uVar1;
  int funcs_id [2];
  double funcs_coef [2];
  
  uVar1 = p->info->number - 0x236;
  if (uVar1 < 4) {
    funcs_id[0] = *(int *)(&DAT_01071168 + (ulong)uVar1 * 4);
    alpha = *(double *)(&DAT_01071178 + (ulong)uVar1 * 8);
    funcs_coef[0] = 1.0 - alpha;
    funcs_id[1] = 0x232;
    funcs_coef[1] = 1.0;
    xc_mix_init(p,2,funcs_id,funcs_coef);
    xc_hyb_init_hybrid(p,alpha);
    return;
  }
  fwrite("Internal error in hyb_mgga_xc_kcis\n",0x23,1,_stderr);
  exit(1);
}

Assistant:

static void
hyb_mgga_xc_kcis_init(xc_func_type *p)
{
  /* Exchange functional */
  int xid;
  /* Fraction of exact exchange */
  double exx;
  /* Array */
  int funcs_id[2];
  double funcs_coef[2];

  switch(p->info->number){
  case XC_HYB_MGGA_XC_MPW1KCIS:
    xid=XC_GGA_X_MPW91;
    exx=0.15;
    break;
  case XC_HYB_MGGA_XC_MPWKCIS1K:
    xid=XC_GGA_X_MPW91;
    exx=0.41;
    break;
  case XC_HYB_MGGA_XC_PBE1KCIS:
    xid=XC_GGA_X_PBE;
    exx=0.22;
    break;
  case XC_HYB_MGGA_XC_TPSS1KCIS:
    xid=XC_MGGA_X_TPSS;
    exx=0.13;
    break;
  default:
    fprintf(stderr, "Internal error in hyb_mgga_xc_kcis\n");
    exit(1);
  }

  /* Initialize mix */
  funcs_id[0] = xid;
  funcs_coef[0] = 1.0 - exx;

  funcs_id[1] = XC_MGGA_C_KCIS;
  funcs_coef[1] = 1.0;

  xc_mix_init(p, 2, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, exx);
}